

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binjgb.c
# Opt level: O0

void parse_arguments(int argc,char **argv)

{
  int iVar1;
  OptionParser *parser_00;
  undefined1 local_40 [8];
  OptionResult result;
  int done;
  int errors;
  OptionParser *parser;
  char **argv_local;
  int argc_local;
  
  parser_00 = option_parser_new(parse_arguments::options,9,argc,argv);
  result.field_2._4_4_ = 0;
  result.field_2._0_4_ = 0;
  while (result.field_2._0_4_ == 0) {
    option_parser_next((OptionResult *)local_40,parser_00);
    switch(local_40._0_4_) {
    case 0:
      fprintf(_stderr,"ERROR: Unknown option: %s.\n\n",result.option);
LAB_00120bf5:
      usage(argc,argv);
      option_parser_delete(parser_00);
      exit(1);
    case 1:
      fprintf(_stderr,"ERROR: Option --%s requires a value.\n\n",*(undefined8 *)(result._0_8_ + 8));
      goto LAB_00120bf5;
    case 2:
      fprintf(_stderr,"ERROR: Short option -%c is too long: %s.\n\n",
              (ulong)(uint)(int)*(char *)result._0_8_,result.option);
      goto LAB_00120bf5;
    case 3:
      switch(*(undefined1 *)result._0_8_) {
      case 0x43:
        s_cgb_color_curve = atoi(&(result.option)->short_name);
        break;
      default:
        iVar1 = strcmp(*(char **)(result._0_8_ + 8),"force-dmg");
        if (iVar1 == 0) {
          s_force_dmg = TRUE;
        }
        else {
          iVar1 = strcmp(*(char **)(result._0_8_ + 8),"sgb-border");
          if (iVar1 != 0) {
            abort();
          }
          s_use_sgb_border = TRUE;
        }
        break;
      case 0x4a:
        s_write_joypad_filename = &(result.option)->short_name;
        break;
      case 0x50:
        s_builtin_palette = atoi(&(result.option)->short_name);
        break;
      case 0x68:
        goto LAB_00120bf5;
      case 0x6a:
        s_read_joypad_filename = &(result.option)->short_name;
        break;
      case 0x73:
        s_random_seed = atoi(&(result.option)->short_name);
        break;
      case 0x78:
        s_render_scale = atoi(&(result.option)->short_name);
      }
      break;
    case 4:
      s_rom_filename = &(result.option)->short_name;
      break;
    case 5:
      result.field_2._0_4_ = 1;
    }
  }
  if (s_rom_filename != (char *)0x0) {
    option_parser_delete(parser_00);
    return;
  }
  fprintf(_stderr,"ERROR: expected input .gb\n\n");
  goto LAB_00120bf5;
}

Assistant:

void parse_arguments(int argc, char** argv) {
  static const Option options[] = {
    {'h', "help", 0},
    {'j', "read-joypad", 1},
    {'J', "write-joypad", 1},
    {'s', "seed", 1},
    {'P', "palette", 1},
    {'x', "scale", 1},
    {'C', "cgb-color", 1},
    {0, "force-dmg", 0},
    {0, "sgb-border", 0},
  };

  struct OptionParser* parser = option_parser_new(
      options, sizeof(options) / sizeof(options[0]), argc, argv);

  int errors = 0;
  int done = 0;
  while (!done) {
    OptionResult result = option_parser_next(parser);
    switch (result.kind) {
      case OPTION_RESULT_KIND_UNKNOWN:
        PRINT_ERROR("ERROR: Unknown option: %s.\n\n", result.arg);
        goto error;

      case OPTION_RESULT_KIND_EXPECTED_VALUE:
        PRINT_ERROR("ERROR: Option --%s requires a value.\n\n",
                    result.option->long_name);
        goto error;

      case OPTION_RESULT_KIND_BAD_SHORT_OPTION:
        PRINT_ERROR("ERROR: Short option -%c is too long: %s.\n\n",
                    result.option->short_name, result.arg);
        goto error;

      case OPTION_RESULT_KIND_OPTION:
        switch (result.option->short_name) {
          case 'h':
            goto error;

          case 'j':
            s_read_joypad_filename = result.value;
            break;

          case 'J':
            s_write_joypad_filename = result.value;
            break;

          case 's':
            s_random_seed = atoi(result.value);
            break;

          case 'P':
            s_builtin_palette = atoi(result.value);
            break;

          case 'x':
            s_render_scale = atoi(result.value);
            break;

          case 'C':
            s_cgb_color_curve = atoi(result.value);
            break;

          default:
            if (strcmp(result.option->long_name, "force-dmg") == 0) {
              s_force_dmg = TRUE;
            } else if (strcmp(result.option->long_name, "sgb-border") == 0) {
              s_use_sgb_border = TRUE;
            } else {
              abort();
            }
            break;
        }
        break;

      case OPTION_RESULT_KIND_ARG:
        s_rom_filename = result.value;
        break;

      case OPTION_RESULT_KIND_DONE:
        done = 1;
        break;
    }
  }

  if (!s_rom_filename) {
    PRINT_ERROR("ERROR: expected input .gb\n\n");
    goto error;
  }

  option_parser_delete(parser);
  return;

error:
  usage(argc, argv);
  option_parser_delete(parser);
  exit(1);
}